

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cxx::SuperClassName_abi_cxx11_
          (string *__return_storage_ptr__,cxx *this,Descriptor *descriptor)

{
  char *pcVar1;
  bool bVar2;
  
  bVar2 = *(int *)(*(long *)(*(long *)(this + 0x10) + 0x88) + 0x50) == 3;
  pcVar1 = "::google::protobuf::Message";
  if (bVar2) {
    pcVar1 = "::google::protobuf::MessageLite";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (ulong)bVar2 * 4 + 0x1b);
  return __return_storage_ptr__;
}

Assistant:

string SuperClassName(const Descriptor* descriptor) {
  return HasDescriptorMethods(descriptor->file()) ?
      "::google::protobuf::Message" : "::google::protobuf::MessageLite";
}